

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCube::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCube *this,int level,int layer)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)level;
  lVar1 = (long)(this->m_texture).m_access[(uint)(&tcuFaceMapping)[layer]].
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format =
       *(TextureFormat *)(lVar1 + lVar2 * 0x28);
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[2] =
       *(int *)(lVar1 + 0x10 + lVar2 * 0x28);
  *(undefined8 *)(__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data =
       *(undefined8 *)(lVar1 + 8 + lVar2 * 0x28);
  *(undefined8 *)(__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data =
       *(undefined8 *)(lVar1 + 0x14 + lVar2 * 0x28);
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[2] =
       *(int *)(lVar1 + 0x1c + lVar2 * 0x28);
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data =
       *(void **)(lVar1 + 0x20 + lVar2 * 0x28);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCube::getLevel (int level, int layer)
{
	return m_texture.getLevelFace(level, tcuFaceMapping[layer]);
}